

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_astDataType *
add_type_coercion(Context_conflict *ctx,MOJOSHADER_astExpression **left,
                 MOJOSHADER_astDataType *_ldatatype,MOJOSHADER_astExpression **right,
                 MOJOSHADER_astDataType *_rdatatype)

{
  MOJOSHADER_astDataTypeType MVar1;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_astDataType *pMVar3;
  int *piVar4;
  MOJOSHADER_astExpression *pMVar5;
  ulong uVar6;
  long lVar7;
  MOJOSHADER_astDataTypeType MVar8;
  MOJOSHADER_astDataTypeType *pMVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  pMVar2 = reduce_datatype(ctx,_ldatatype);
  pMVar3 = reduce_datatype(ctx,_rdatatype);
  if (pMVar2 != pMVar3) {
    if (pMVar2 == (MOJOSHADER_astDataType *)0x0) {
      uVar6 = 6;
      bVar12 = true;
      bVar11 = true;
    }
    else {
      MVar1 = pMVar2->type;
      bVar12 = MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR;
      bVar11 = MVar1 - MOJOSHADER_AST_DATATYPE_BUFFER < 0xfffffffe;
      MVar8 = MVar1;
      if (!bVar11) {
        MVar8 = ((pMVar2->array).base)->type;
      }
      bVar11 = bVar11 || MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR;
      uVar6 = 0;
      for (pMVar9 = &DAT_00144fa0; (uVar6 != 6 && (*pMVar9 != MVar8)); pMVar9 = pMVar9 + 4) {
        uVar6 = uVar6 + 1;
      }
    }
    if (pMVar3 != (MOJOSHADER_astDataType *)0x0) {
      MVar1 = pMVar3->type;
      bVar13 = (MVar1 & ~MOJOSHADER_AST_DATATYPE_BOOL) == MOJOSHADER_AST_DATATYPE_VECTOR;
      MVar8 = MVar1;
      if (bVar13) {
        MVar8 = ((pMVar3->array).base)->type;
      }
      piVar4 = (int *)&DAT_00144fac;
      for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
        if (piVar4[-3] == MVar8) {
          if (5 < uVar10 || 5 < uVar6) break;
          if ((left == (MOJOSHADER_astExpression **)0x0) ||
             (!bVar11 && (!bVar13 || MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR))) {
LAB_0012e69a:
            pMVar5 = new_cast_expr(ctx,_ldatatype,*right);
            *right = pMVar5;
            return _ldatatype;
          }
          if (!(bool)(bVar11 & (bVar13 && MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR))) {
            if ((bool)(~bVar12 & MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR)) goto LAB_0012e69a;
            if (!(bool)(bVar12 & MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR)) {
              lVar7 = uVar6 * 0x10;
              if (piVar4[-2] < *(int *)(&UNK_00144fa4 + lVar7)) goto LAB_0012e69a;
              if (piVar4[-2] <= *(int *)(&UNK_00144fa4 + lVar7)) {
                if (*(int *)(&DAT_00144fac + lVar7) == 0) {
                  if (*piVar4 != 0) goto LAB_0012e649;
                }
                else if (*piVar4 == 0) goto LAB_0012e69a;
                if (*(int *)(&UNK_00144fa8 + lVar7) != 0) {
                  if (piVar4[-1] == 0) goto LAB_0012e69a;
                  break;
                }
                if (piVar4[-1] == 0) break;
              }
            }
          }
LAB_0012e649:
          pMVar5 = new_cast_expr(ctx,_rdatatype,*left);
          *left = pMVar5;
          return _rdatatype;
        }
        piVar4 = piVar4 + 4;
      }
    }
    fail(ctx,"incompatible data types");
    delete_expr(ctx,*right);
    pMVar5 = new_literal_int_expr(ctx,0);
    pMVar5 = new_cast_expr(ctx,_ldatatype,pMVar5);
    *right = pMVar5;
  }
  return pMVar2;
}

Assistant:

static const MOJOSHADER_astDataType *add_type_coercion(Context *ctx,
                                     MOJOSHADER_astExpression **left,
                                     const MOJOSHADER_astDataType *_ldatatype,
                                     MOJOSHADER_astExpression **right,
                                     const MOJOSHADER_astDataType *_rdatatype)
{
    // !!! FIXME: this whole function is probably naive at best.
    const MOJOSHADER_astDataType *ldatatype = reduce_datatype(ctx, _ldatatype);
    const MOJOSHADER_astDataType *rdatatype = reduce_datatype(ctx, _rdatatype);

    if (ldatatype == rdatatype)
        return ldatatype;   // they already match, so we're done.

    struct {
        const MOJOSHADER_astDataTypeType type;
        const int bits;
        const int is_unsigned;
        const int floating;
    } typeinf[] = {
        { MOJOSHADER_AST_DATATYPE_BOOL,    1, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_HALF,   16, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_INT,    32, 0, 0 },
        { MOJOSHADER_AST_DATATYPE_UINT,   32, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_FLOAT,  32, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_DOUBLE, 64, 0, 1 },
    };

    int lvector = 0;
    int lmatrix = 0;
    int l = STATICARRAYLEN(typeinf);
    if (ldatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = ldatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            lvector = 1;
            type = ldatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            lmatrix = 1;
            type = ldatatype->matrix.base->type;
        } // if

        for (l = 0; l < STATICARRAYLEN(typeinf); l++)
        {
            if (typeinf[l].type == type)
                break;
        } // for
    } // if

    int rvector = 0;
    int rmatrix = 0;
    int r = STATICARRAYLEN(typeinf);
    if (rdatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = rdatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            rvector = 1;
            type = rdatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            rmatrix = 1;
            type = rdatatype->matrix.base->type;
        } // if

        for (r = 0; r < STATICARRAYLEN(typeinf); r++)
        {
            if (typeinf[r].type == type)
                break;
        } // for
    } // if

    enum { CHOOSE_NEITHER, CHOOSE_LEFT, CHOOSE_RIGHT } choice = CHOOSE_NEITHER;
    if ((l < STATICARRAYLEN(typeinf)) && (r < STATICARRAYLEN(typeinf)))
    {
        if (left == NULL)
            choice = CHOOSE_LEFT;  // we need to force to the lvalue.
        else if (lmatrix && !rmatrix)
            choice = CHOOSE_LEFT;
        else if (!lmatrix && rmatrix)
            choice = CHOOSE_RIGHT;
        else if (lvector && !rvector)
            choice = CHOOSE_LEFT;
        else if (!lvector && rvector)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].bits > typeinf[r].bits)
            choice = CHOOSE_LEFT;
        else if (typeinf[l].bits < typeinf[r].bits)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].floating && !typeinf[r].floating)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].floating && typeinf[r].floating)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].is_unsigned && !typeinf[r].is_unsigned)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].is_unsigned && typeinf[r].is_unsigned)
            choice = CHOOSE_RIGHT;
    } // if

    if (choice == CHOOSE_LEFT)
    {
        *right = new_cast_expr(ctx, _ldatatype, *right);
        return _ldatatype;
    } // if
    else if (choice == CHOOSE_RIGHT)
    {
        *left = new_cast_expr(ctx, _rdatatype, *left);
        return _rdatatype;
    } // else if

    assert(choice == CHOOSE_NEITHER);
    fail(ctx, "incompatible data types");
    // Ditch original (*right), force a literal value that matches
    //  ldatatype, so further processing is normalized.
    // !!! FIXME: force (right) to match (left).
    delete_expr(ctx, *right);
    *right = new_cast_expr(ctx, _ldatatype, new_literal_int_expr(ctx, 0));
    return ldatatype;
}